

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

int ip_str_to_ip(AP_CTX *ctx,char *ip_str,uint32_t *ip)

{
  int iVar1;
  long lVar2;
  uint ip_bytes [4];
  uint local_28;
  undefined1 local_24 [4];
  undefined1 local_20 [4];
  undefined1 local_1c [4];
  
  *ip = 0;
  iVar1 = __isoc99_sscanf(ip_str,"%u.%u.%u.%u",&local_28,local_24,local_20,local_1c);
  if (iVar1 == 4) {
    lVar2 = 0;
    do {
      if (0xff < *(uint *)(local_24 + lVar2 * 4 + -4)) goto LAB_00103323;
      *ip = *ip << 8 | *(uint *)(local_24 + lVar2 * 4 + -4);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    iVar1 = 0;
  }
  else {
LAB_00103323:
    ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid ip address \'%s\'\n",ctx->client_ip,ip_str);
    iVar1 = 0xb;
  }
  return iVar1;
}

Assistant:

static int ip_str_to_ip (AP_CTX *ctx, const char *ip_str, uint32_t *ip)
{
    int				rc				= AP_NO_ERROR;
	int				rc_os;
	unsigned int	ip_bytes[4];
	unsigned int	i;

	*ip = 0;

	rc_os = sscanf (ip_str, "%u.%u.%u.%u", &ip_bytes[0], &ip_bytes[1], &ip_bytes[2], &ip_bytes[3]);
    if (rc_os != 4)
	{
		ap_error ("(%s) Invalid ip address '%s'\n", ctx->client_ip, ip_str);
		rc = AP_ERROR_IP_NOT_VALID;
        
		goto finish;
	}
 
	for (i = 0; i < 4; i ++)
	{
		if (ip_bytes[i] > 255)
		{
			ap_error ("(%s) Invalid ip address '%s'\n", ctx->client_ip, ip_str);
			rc = AP_ERROR_IP_NOT_VALID;
        
			goto finish;
		}

		*ip = (*ip << 8) | ip_bytes[i];
	}

finish:
    return rc;
}